

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGB4444ToYRow_C(uint8_t *src_argb4444,uint8_t *dst_y,int width)

{
  byte bVar1;
  int iVar2;
  int in_EDX;
  undefined1 *in_RSI;
  byte *in_RDI;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int x;
  int local_18;
  undefined1 *local_10;
  byte *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    bVar1 = (byte)((int)(uint)*local_8 >> 4);
    iVar2 = libyuv::RGBToY((local_8[1] & 0xf) << 4 | local_8[1] & 0xf,bVar1 << 4 | bVar1,
                           (*local_8 & 0xf) << 4 | *local_8 & 0xf);
    *local_10 = (char)iVar2;
    local_8 = local_8 + 2;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void ARGB4444ToYRow_C(const uint8_t* src_argb4444, uint8_t* dst_y, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t b = src_argb4444[0] & 0x0f;
    uint8_t g = src_argb4444[0] >> 4;
    uint8_t r = src_argb4444[1] & 0x0f;
    b = (b << 4) | b;
    g = (g << 4) | g;
    r = (r << 4) | r;
    dst_y[0] = RGBToY(r, g, b);
    src_argb4444 += 2;
    dst_y += 1;
  }
}